

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TheoryAxioms.cpp
# Opt level: O1

void __thiscall Shell::TheoryAxioms::addAcyclicityAxiom(TheoryAxioms *this,TermAlgebra *ta)

{
  bool bVar1;
  uint subtermPredicate;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  uint64_t uVar5;
  initializer_list<Kernel::Literal_*> lits;
  Stack<Kernel::TermList> local_68;
  TheoryAxioms *local_40;
  Literal *local_38;
  
  local_40 = this;
  subtermPredicate = TermAlgebra::getSubtermPredicate(ta);
  if ((ta->_allowsCyclicTerms == false) && (ta->_n != 0)) {
    uVar4 = 0;
    bVar2 = false;
    do {
      if ((ta->_constrs)._capacity <= uVar4) {
        ::Lib::Array<Shell::TermAlgebraConstructor_*>::expandToFit(&ta->_constrs,uVar4);
      }
      bVar1 = addSubtermDefinitions(local_40,subtermPredicate,(ta->_constrs)._array[uVar4]);
      if (bVar1) {
        bVar2 = true;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < ta->_n);
    if (bVar2) {
      local_68._cursor = (TermList *)0x0;
      local_68._end = (TermList *)0x0;
      local_68._capacity = 0;
      local_68._stack = (TermList *)0x0;
      uVar3 = *(uint *)((ta->_sort)._content + 0xc) & 0xfffffff;
      if (uVar3 != 0) {
        uVar5 = 1;
        uVar4 = 0;
        do {
          if (local_68._cursor == local_68._end) {
            ::Lib::Stack<Kernel::TermList>::expand(&local_68);
          }
          (local_68._cursor)->_content = uVar5;
          local_68._cursor = local_68._cursor + 1;
          uVar4 = uVar4 + 1;
          uVar3 = *(uint *)((ta->_sort)._content + 0xc) & 0xfffffff;
          uVar5 = uVar5 + 4;
        } while (uVar4 < uVar3);
      }
      if (local_68._cursor == local_68._end) {
        ::Lib::Stack<Kernel::TermList>::expand(&local_68);
      }
      (local_68._cursor)->_content = (ulong)(uVar3 * 4 + 1);
      local_68._cursor = local_68._cursor + 1;
      uVar3 = *(uint *)((ta->_sort)._content + 0xc);
      if (local_68._cursor == local_68._end) {
        ::Lib::Stack<Kernel::TermList>::expand(&local_68);
      }
      (local_68._cursor)->_content = (ulong)(uVar3 & 0xfffffff) * 4 + 1;
      local_68._cursor = local_68._cursor + 1;
      local_38 = Kernel::Literal::create
                           (subtermPredicate,(*(uint *)((ta->_sort)._content + 0xc) & 0xfffffff) + 2
                            ,false,local_68._stack);
      lits._M_len = 1;
      lits._M_array = &local_38;
      addTheoryClauseFromLits(local_40,lits,TERM_ALGEBRA_ACYCLICITY_AXIOM,0);
      if (local_68._stack != (TermList *)0x0) {
        uVar4 = local_68._capacity * 8 + 0xf & 0xfffffffffffffff0;
        if (uVar4 == 0) {
          (local_68._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_68._stack;
        }
        else if (uVar4 < 0x11) {
          (local_68._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_68._stack;
        }
        else if (uVar4 < 0x19) {
          (local_68._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_68._stack;
        }
        else if (uVar4 < 0x21) {
          (local_68._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_68._stack;
        }
        else if (uVar4 < 0x31) {
          (local_68._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_68._stack;
        }
        else if (uVar4 < 0x41) {
          (local_68._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_68._stack;
        }
        else {
          operator_delete(local_68._stack,0x10);
        }
      }
    }
  }
  return;
}

Assistant:

void TheoryAxioms::addAcyclicityAxiom(TermAlgebra* ta)
{
  unsigned pred = ta->getSubtermPredicate();

  if (ta->allowsCyclicTerms()) {
    return;
  }

  bool rec = false;

  for (unsigned i = 0; i < ta->nConstructors(); i++) {
    if (addSubtermDefinitions(pred, ta->constructor(i))) {
      rec = true;
    }
  }

  // rec <=> the subterm relation is non-empty
  if (!rec) {
    return;
  }

  TermStack args;
  for (unsigned i = 0; i < ta->nTypeArgs(); i++) {
    args.push(TermList(i,false));
  }
  args.push(TermList(ta->nTypeArgs(),false));
  args.push(TermList(ta->nTypeArgs(),false));

  Literal* sub = Literal::create(pred, ta->nTypeArgs()+2, false, args.begin());
  addTheoryClauseFromLits({sub}, InferenceRule::TERM_ALGEBRA_ACYCLICITY_AXIOM,CHEAP);
}